

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReshapeStaticLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  bool bVar1;
  int iVar2;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  ReshapeStaticLayerParams *params;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,1);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar1 = Result::good((Result *)(local_70 + 0x28));
  if (bVar1) {
    validateOutputCount((Result_conflict *)&params,(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)&params);
    Result::~Result((Result *)&params);
  }
  local_d0._M_storage._M_storage =
       (uchar  [8])Specification::NeuralNetworkLayer::reshapestatic((NeuralNetworkLayer *)r._32_8_);
  iVar2 = Specification::ReshapeStaticLayerParams::targetshape_size
                    ((ReshapeStaticLayerParams *)local_d0._M_storage._M_storage);
  if (iVar2 == 0) {
    __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
    std::operator+(&local_f0,"Target shape is required parameter for \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                   &local_f0,"\' layer.");
    std::__cxx11::string::~string((string *)&local_f0);
    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
  }
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReshapeStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.reshapestatic();
    if (params.targetshape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}